

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

QString * __thiscall
QFileSystemModelPrivate::displayName
          (QString *__return_storage_ptr__,QFileSystemModelPrivate *this,QModelIndex *index)

{
  name(__return_storage_ptr__,this,index);
  return __return_storage_ptr__;
}

Assistant:

QString QFileSystemModelPrivate::displayName(const QModelIndex &index) const
{
#if defined(Q_OS_WIN)
    QFileSystemNode *dirNode = node(index);
    if (!dirNode->volumeName.isEmpty())
        return dirNode->volumeName;
#endif
    return name(index);
}